

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::copy_raytracing_pipeline
          (Impl *this,VkRayTracingPipelineCreateInfoKHR *create_info,ScratchAllocator *alloc,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
          VkRayTracingPipelineCreateInfoKHR **out_info)

{
  VkPipelineLibraryCreateInfoKHR **sub_info;
  uint uVar1;
  VkPipelineLibraryCreateInfoKHR *pVVar2;
  VkPipeline *__src;
  VkRayTracingShaderGroupCreateInfoKHR *pVVar3;
  bool bVar4;
  VkBaseInStructure *base_in;
  VkRayTracingPipelineCreateInfoKHR *info;
  int *piVar5;
  VkPipeline *__dest;
  VkRayTracingShaderGroupCreateInfoKHR *__dest_00;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  long *in_FS_OFFSET;
  void *local_38;
  
  info = (VkRayTracingPipelineCreateInfoKHR *)ScratchAllocator::allocate_raw(alloc,0x68,0x10);
  if (info != (VkRayTracingPipelineCreateInfoKHR *)0x0) {
    memmove(info,create_info,0x68);
  }
  uVar1 = info->flags;
  info->flags = uVar1 & 0x7ffffc3f;
  for (piVar5 = (int *)info->pNext; piVar5 != (int *)0x0; piVar5 = *(int **)(piVar5 + 2)) {
    if (*piVar5 == 0x3ba1f5f5) {
      info->flags = 0;
      goto LAB_00124bd2;
    }
  }
  if ((uVar1 & 4) == 0) {
LAB_00124bd2:
    info->basePipelineHandle = (VkPipeline)0x0;
  }
  else if (info->basePipelineHandle == (VkPipeline)0x0) {
    uVar1 = info->basePipelineIndex;
    if (-1 < (long)(int)uVar1) {
      if (base_pipeline_count <= uVar1) {
        if (*(int *)(*in_FS_OFFSET + -0x18) < 3) {
          bVar4 = Internal::log_thread_callback(LOG_ERROR,"Base pipeline index is out of range.\n");
          if (bVar4) {
            return false;
          }
          copy_raytracing_pipeline();
        }
        return false;
      }
      info->basePipelineHandle = base_pipelines[(int)uVar1];
    }
  }
  info->basePipelineIndex = -1;
  bVar4 = copy_stages<VkRayTracingPipelineCreateInfoKHR>
                    (this,info,alloc,device,gsmcii,(DynamicStateInfo *)0x0);
  if (!bVar4) {
    return false;
  }
  bVar4 = copy_dynamic_state<VkRayTracingPipelineCreateInfoKHR>
                    (this,info,alloc,(DynamicStateInfo *)0x0);
  if (!bVar4) {
    return false;
  }
  sub_info = &info->pLibraryInfo;
  bVar4 = copy_sub_create_info<VkPipelineLibraryCreateInfoKHR>
                    (this,sub_info,alloc,(DynamicStateInfo *)0x0,0);
  if (!bVar4) {
    return false;
  }
  bVar4 = copy_sub_create_info<VkRayTracingPipelineInterfaceCreateInfoKHR>
                    (this,&info->pLibraryInterface,alloc,(DynamicStateInfo *)0x0,0);
  if (!bVar4) {
    return false;
  }
  pVVar2 = *sub_info;
  if (pVVar2 == (VkPipelineLibraryCreateInfoKHR *)0x0) goto LAB_00124cf5;
  if ((ulong)pVVar2->libraryCount == 0) {
LAB_00124ceb:
    __dest = (VkPipeline *)0x0;
  }
  else {
    __src = pVVar2->pLibraries;
    sVar6 = (ulong)pVVar2->libraryCount << 3;
    __dest = (VkPipeline *)ScratchAllocator::allocate_raw(alloc,sVar6,0x10);
    if (__dest == (VkPipeline *)0x0) goto LAB_00124ceb;
    memmove(__dest,__src,sVar6);
  }
  (*sub_info)->pLibraries = __dest;
LAB_00124cf5:
  if ((ulong)info->groupCount == 0) {
    info->pGroups = (VkRayTracingShaderGroupCreateInfoKHR *)0x0;
  }
  else {
    pVVar3 = info->pGroups;
    sVar6 = (ulong)info->groupCount * 0x30;
    __dest_00 = (VkRayTracingShaderGroupCreateInfoKHR *)
                ScratchAllocator::allocate_raw(alloc,sVar6,0x10);
    if (__dest_00 != (VkRayTracingShaderGroupCreateInfoKHR *)0x0) {
      memmove(__dest_00,pVVar3,sVar6);
    }
    info->pGroups = __dest_00;
    if (info->groupCount != 0) {
      lVar8 = 8;
      uVar7 = 0;
      do {
        pVVar3 = info->pGroups;
        local_38 = (void *)0x0;
        bVar4 = copy_pnext_chain(this,*(void **)((long)&pVVar3->sType + lVar8),alloc,&local_38,
                                 (DynamicStateInfo *)0x0,0);
        if (!bVar4) {
          return false;
        }
        *(void **)((long)&pVVar3->sType + lVar8) = local_38;
        *(undefined8 *)((long)&pVVar3->intersectionShader + lVar8) = 0;
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 0x30;
      } while (uVar7 < info->groupCount);
    }
  }
  bVar4 = copy_pnext_chain(this,info->pNext,alloc,&info->pNext,(DynamicStateInfo *)0x0,0);
  if (bVar4) {
    *out_info = info;
  }
  return bVar4;
}

Assistant:

bool StateRecorder::Impl::copy_raytracing_pipeline(const VkRayTracingPipelineCreateInfoKHR *create_info,
                                                   ScratchAllocator &alloc, const VkPipeline *base_pipelines,
                                                   uint32_t base_pipeline_count,
                                                   VkDevice device, PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
                                                   VkRayTracingPipelineCreateInfoKHR **out_info)
{
	auto *info = copy(create_info, 1, alloc);
	info->flags = normalize_pipeline_creation_flags(info->flags);
	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, info->pNext))
		info->flags = 0;

	if (!update_derived_pipeline(info, base_pipelines, base_pipeline_count))
		return false;

	if (!copy_stages(info, alloc, device, gsmcii, nullptr))
		return false;
	if (!copy_dynamic_state(info, alloc, nullptr))
		return false;

	if (!copy_sub_create_info(info->pLibraryInfo, alloc, nullptr, 0))
		return false;
	if (!copy_sub_create_info(info->pLibraryInterface, alloc, nullptr, 0))
		return false;

	if (info->pLibraryInfo)
	{
		const_cast<VkPipelineLibraryCreateInfoKHR *>(info->pLibraryInfo)->pLibraries =
				copy(info->pLibraryInfo->pLibraries, info->pLibraryInfo->libraryCount, alloc);
	}

	info->pGroups = copy(info->pGroups, info->groupCount, alloc);
	for (uint32_t i = 0; i < info->groupCount; i++)
	{
		auto &group = const_cast<VkRayTracingShaderGroupCreateInfoKHR &>(info->pGroups[i]);
		const void *pNext = nullptr;
		if (!copy_pnext_chain(group.pNext, alloc, &pNext, nullptr, 0))
			return false;
		group.pNext = pNext;
		group.pShaderGroupCaptureReplayHandle = nullptr;
	}

	if (!copy_pnext_chain(info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	*out_info = info;
	return true;
}